

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O0

void __thiscall strain_example1_Test::TestBody(strain_example1_Test *this)

{
  bool bVar1;
  measurement *pmVar2;
  char *pcVar3;
  uint64_t in_RCX;
  string *__return_storage_ptr__;
  AssertHelper local_f0;
  Message local_e8;
  string local_e0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_a0 [8];
  measurement distortion;
  Message local_88 [3];
  string local_70;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  measurement strain;
  measurement length;
  measurement deltaLength;
  strain_example1_Test *this_local;
  
  join_0x00000000_0x00001200_ = units::operator*(1e-05,(unit *)&units::m);
  join_0x00000000_0x00001200_ = units::operator*(1.0,(unit *)&units::m);
  join_0x00000000_0x00001200_ =
       units::measurement::operator/((measurement *)&length.units_,(measurement *)&strain.units_);
  pmVar2 = (measurement *)units::getDefaultFlags();
  __return_storage_ptr__ = &local_70;
  units::to_string_abi_cxx11_(__return_storage_ptr__,(units *)&gtest_ar.message_,pmVar2,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_50,"to_string(strain)","\"1e-05\"",__return_storage_ptr__,
             (char (*) [6])"1e-05");
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    __return_storage_ptr__ = (string *)0x11e;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&distortion.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x11e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&distortion.units_,local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&distortion.units_);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  join_0x00000000_0x00001200_ = units::operator*(10.0,(unit *)&units::ft);
  _local_a0 = units::measurement::operator*
                        ((measurement *)&gtest_ar.message_,(measurement *)&gtest_ar_1.message_);
  pmVar2 = (measurement *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_e0,(units *)local_a0,pmVar2,(uint64_t)__return_storage_ptr__);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
            ((EqHelper *)local_c0,"to_string(distortion)","\"0.0001 ft\"",&local_e0,
             (char (*) [10])"0.0001 ft");
  std::__cxx11::string::~string((string *)&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x122,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  return;
}

Assistant:

TEST(strain, example1)
{
    measurement deltaLength = 0.00001 * m;
    measurement length = 1 * m;

    auto strain = deltaLength / length;

    EXPECT_EQ(to_string(strain), "1e-05");

    // applied to a 10 ft bar
    auto distortion = strain * (10 * ft);
    EXPECT_EQ(to_string(distortion), "0.0001 ft");
}